

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined8 uVar13;
  undefined4 uVar20;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined8 uVar28;
  int *piVar35;
  pointer piVar36;
  int iVar37;
  undefined1 uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  ulong uVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int k;
  int iVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  float *pfVar50;
  ulong __n;
  Mat *pMVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_g;
  long local_138;
  allocator_type local_129;
  ulong local_128;
  int local_120;
  int local_11c;
  Mat *local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  long local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  Mat local_d8;
  Mat local_90;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  undefined4 uVar22;
  undefined3 uVar24;
  undefined2 uVar26;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined3 uVar31;
  undefined1 uVar32;
  undefined2 uVar33;
  undefined1 uVar34;
  
  uVar3 = bottom_blob->c;
  iVar46 = this->kernel_w;
  iVar44 = this->dilation_w;
  iVar45 = this->kernel_h;
  iVar39 = this->dilation_h;
  local_90.elemsize = bottom_blob->elemsize;
  local_90.data = bottom_blob->data;
  local_90.refcount = bottom_blob->refcount;
  local_90.elempack = bottom_blob->elempack;
  local_90.allocator = bottom_blob->allocator;
  local_90.dims = bottom_blob->dims;
  local_90.w = bottom_blob->w;
  local_90.h = bottom_blob->h;
  local_90.d = bottom_blob->d;
  local_90.cstep = bottom_blob->cstep;
  if (local_90.refcount != (int *)0x0) {
    LOCK();
    *local_90.refcount = *local_90.refcount + 1;
    UNLOCK();
  }
  local_90.c = uVar3;
  if (local_90.elemsize != 1) {
    local_d8.data = *(void **)opt;
    uVar5 = opt->openmp_blocktime;
    uVar6 = opt->use_winograd_convolution;
    uVar8 = opt->use_sgemm_convolution;
    uVar10 = opt->use_int8_inference;
    uVar12 = opt->use_vulkan_compute;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar13._0_1_ = opt->use_shader_pack8;
    uVar13._1_1_ = opt->use_subgroup_basic;
    uVar13._2_1_ = opt->use_subgroup_vote;
    uVar13._3_1_ = opt->use_subgroup_ballot;
    uVar14 = opt->use_subgroup_shuffle;
    uVar15 = opt->use_image_storage;
    uVar17 = opt->use_tensor_storage;
    uVar19 = opt->use_reserved_0;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar13._4_4_ = CONCAT31(uVar16,uVar14);
    uVar20 = opt->flush_denormals;
    uVar21 = opt->use_local_pool_allocator;
    uVar23 = opt->use_shader_local_memory;
    uVar25 = opt->use_cooperative_matrix;
    uVar27 = opt->use_winograd23_convolution;
    uVar26 = CONCAT11(uVar27,uVar25);
    uVar24 = CONCAT21(uVar26,uVar23);
    uVar22 = CONCAT31(uVar24,uVar21);
    uVar28._0_1_ = opt->use_winograd43_convolution;
    uVar28._1_1_ = opt->use_winograd63_convolution;
    uVar28._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar28._3_1_ = opt->use_reserved_7;
    uVar29 = opt->use_reserved_8;
    uVar30 = opt->use_reserved_9;
    uVar32 = opt->use_reserved_10;
    uVar34 = opt->use_reserved_11;
    uVar33 = CONCAT11(uVar34,uVar32);
    uVar31 = CONCAT21(uVar33,uVar30);
    uVar28._4_4_ = CONCAT31(uVar31,uVar29);
    local_d8.c = (int)uVar28;
    local_d8.dims = (int)uVar13;
    local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_d8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_d8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_d8.elempack = uVar5;
    local_d8._28_4_ = uVar7;
    local_d8.w = uVar13._4_4_;
    local_d8.h = uVar20;
    local_d8.d = uVar22;
    local_d8._60_4_ = uVar28._4_4_;
    quantize_to_int8(bottom_blob,&local_90,&this->bottom_blob_int8_scales,(Option *)&local_d8);
  }
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  make_padding(this,&local_90,&local_d8,this->kernel_w,this->kernel_h,opt);
  iVar37 = local_d8.w;
  iVar40 = -100;
  if ((local_d8.data != (void *)0x0) && ((long)local_d8.c * local_d8.cstep != 0)) {
    uVar42 = (long)(~((iVar46 + -1) * iVar44) + local_d8.w) / (long)this->stride_w;
    uVar48 = (long)(~((iVar45 + -1) * iVar39) + local_d8.h) / (long)this->stride_h;
    uVar49 = uVar48 & 0xffffffff;
    __n = (long)this->kernel_h * (long)this->kernel_w;
    local_118 = top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&local_f0,__n,&local_129);
    piVar36 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    pMVar51 = local_118;
    iVar46 = this->kernel_h;
    if (0 < iVar46) {
      iVar44 = this->dilation_h;
      iVar45 = this->kernel_w;
      iVar39 = this->dilation_w * iVar45;
      iVar40 = 0;
      iVar41 = 0;
      iVar43 = 0;
      do {
        if (0 < iVar45) {
          lVar47 = 0;
          do {
            local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar40 + lVar47] = iVar43;
            iVar43 = iVar43 + this->dilation_w;
            iVar45 = this->kernel_w;
            lVar47 = lVar47 + 1;
          } while ((int)lVar47 < iVar45);
          iVar40 = iVar40 + (int)lVar47;
          iVar46 = this->kernel_h;
        }
        iVar43 = iVar43 + (iVar37 * iVar44 - iVar39);
        iVar41 = iVar41 + 1;
      } while (iVar41 < iVar46);
    }
    local_11c = this->int8_scale_term;
    local_108 = uVar42 & 0xffffffff;
    Mat::create(local_118,(int)uVar42 + 1,(int)uVar48 + 1,this->num_output,
                (ulong)(local_11c < 0x65) * 3 + 1,opt->blob_allocator);
    iVar40 = -100;
    if ((pMVar51->data != (void *)0x0) && ((long)pMVar51->c * pMVar51->cstep != 0)) {
      iVar46 = this->num_output;
      if (0 < iVar46) {
        local_120 = uVar3 * (int)__n;
        local_138 = 0;
        local_110 = uVar49;
        do {
          if (-1 < (int)uVar49) {
            pfVar50 = (float *)(pMVar51->cstep * local_138 * pMVar51->elemsize + (long)pMVar51->data
                               );
            local_100 = (long)(local_120 * (int)local_138);
            local_128 = 0;
            do {
              if (-1 < (int)local_108) {
                local_f8 = (long)(int)local_128;
                iVar46 = 0;
                do {
                  fVar55 = 0.0;
                  fVar53 = 0.0;
                  if (0 < (int)uVar3) {
                    lVar47 = (long)(this->weight_data).data + local_100;
                    uVar42 = 0;
                    iVar44 = 0;
                    do {
                      if (0 < (int)__n) {
                        uVar48 = 0;
                        do {
                          iVar44 = iVar44 + (int)*(char *)(lVar47 + uVar48) *
                                            (int)*(char *)((long)local_d8.data +
                                                          (long)piVar36[uVar48] +
                                                          local_d8.cstep *
                                                          CONCAT44(local_d8.elemsize._4_4_,
                                                                   (undefined4)local_d8.elemsize) *
                                                          uVar42 + (long)iVar46 *
                                                                   (long)this->stride_w +
                                                                   (long)local_d8.w *
                                                                   CONCAT44(local_d8.elemsize._4_4_,
                                                                            (undefined4)
                                                                            local_d8.elemsize) *
                                                                   this->stride_h * local_f8);
                          uVar48 = uVar48 + 1;
                        } while ((__n & 0xffffffff) != uVar48);
                      }
                      lVar47 = lVar47 + __n;
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar3);
                    fVar53 = (float)iVar44;
                  }
                  fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + local_138 * 4);
                  if (fVar1 != 0.0) {
                    fVar55 = 1.0 / (fVar1 * *(this->bottom_blob_int8_scales).data);
                  }
                  fVar55 = fVar55 * fVar53;
                  if (this->bias_term != 0) {
                    fVar55 = fVar55 + *(float *)((long)(this->bias_data).data + local_138 * 4);
                  }
                  fVar53 = fVar55;
                  switch(this->activation_type) {
                  case 1:
                    if (fVar55 <= 0.0) {
                      fVar53 = 0.0;
                    }
                    break;
                  case 2:
                    fVar53 = (float)(~-(uint)(0.0 < fVar55) & *(this->activation_params).data |
                                    -(uint)(0.0 < fVar55) & 0x3f800000) * fVar55;
                    break;
                  case 3:
                    pfVar4 = (float *)(this->activation_params).data;
                    fVar53 = *pfVar4;
                    if (fVar55 <= fVar53) {
                      fVar55 = fVar53;
                    }
                    fVar53 = pfVar4[1];
                    if (fVar55 <= fVar53) {
                      fVar53 = fVar55;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar55) {
                      fVar55 = 88.37626;
                    }
                    fVar53 = expf((float)(-(uint)(fVar55 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar55 < -88.37626) & (uint)-fVar55));
                    fVar53 = 1.0 / (fVar53 + 1.0);
                    break;
                  case 5:
                    uStack_44 = 0;
                    uStack_40 = 0;
                    uStack_3c = 0;
                    local_48 = fVar55;
                    fVar53 = expf(fVar55);
                    fVar53 = logf(fVar53 + 1.0);
                    fVar53 = tanhf(fVar53);
                    fVar53 = fVar53 * local_48;
                    break;
                  case 6:
                    pfVar4 = (float *)(this->activation_params).data;
                    fVar1 = *pfVar4;
                    fVar2 = pfVar4[1];
                    fVar54 = -fVar2 / fVar1;
                    fVar53 = 0.0;
                    if ((fVar54 <= fVar55) && (fVar53 = fVar55, fVar55 <= fVar54 + 1.0 / fVar1)) {
                      fVar53 = (fVar1 * fVar55 + fVar2) * fVar55;
                    }
                  }
                  if (local_11c < 0x65) {
                    *pfVar50 = fVar53;
                    lVar47 = 4;
                  }
                  else {
                    fVar53 = roundf(fVar53 * *(this->top_blob_int8_scales).data);
                    iVar44 = (int)fVar53;
                    if (iVar44 < -0x7e) {
                      iVar44 = -0x7f;
                    }
                    uVar38 = (undefined1)iVar44;
                    if (0x7e < iVar44) {
                      uVar38 = 0x7f;
                    }
                    *(undefined1 *)pfVar50 = uVar38;
                    lVar47 = 1;
                  }
                  pfVar50 = (float *)((long)pfVar50 + lVar47);
                  bVar52 = iVar46 != (int)local_108;
                  iVar46 = iVar46 + 1;
                } while (bVar52);
              }
              iVar46 = (int)local_128;
              local_128 = (ulong)(iVar46 + 1);
            } while (iVar46 != (int)local_110);
            iVar46 = this->num_output;
            uVar49 = local_110;
            pMVar51 = local_118;
          }
          local_138 = local_138 + 1;
        } while (local_138 < iVar46);
      }
      iVar40 = 0;
    }
    if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar35 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar35 != (int *)0x0) {
    LOCK();
    *piVar35 = *piVar35 + -1;
    UNLOCK();
    if (*piVar35 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_90.refcount != (int *)0x0) {
    LOCK();
    *local_90.refcount = *local_90.refcount + -1;
    UNLOCK();
    if (*local_90.refcount == 0) {
      if (local_90.allocator == (Allocator *)0x0) {
        if (local_90.data != (void *)0x0) {
          free(local_90.data);
        }
      }
      else {
        (*(local_90.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}